

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeLanguageCommand.cxx
# Opt level: O1

bool cmCMakeLanguageCommand
               (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
               cmExecutionStatus *status)

{
  ulong uVar1;
  ulong uVar2;
  pointer pbVar3;
  cmMakefile *this;
  size_t __n;
  pointer pcVar4;
  pointer pbVar5;
  cmExecutionStatus *pcVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  size_t *psVar8;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *pvVar9;
  size_t *psVar10;
  bool bVar11;
  int iVar12;
  cmState *this_00;
  cmListFileContext *pcVar13;
  pointer pcVar14;
  string *psVar15;
  cmGlobalGenerator *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var17;
  _Alloc_hider _Var18;
  cmListFileArgument *pcVar19;
  undefined8 uVar20;
  size_type __rlen;
  bool bVar21;
  string_view name;
  string_view name_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  string_view separator;
  size_t expArg;
  size_t rawArg;
  SetProviderArgs parsedArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expArgs;
  string fcmasProperty;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> tmpArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  string dir;
  vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_> methods;
  optional<(anonymous_namespace)::Defer> maybeDefer;
  anon_class_40_5_733c87e0 moreArgs;
  Command command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsed;
  anon_class_32_4_cfdc72da finishArgs;
  ulong local_348;
  ulong local_340;
  undefined1 local_338 [16];
  code *local_328;
  code *pcStack_320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  char *local_300;
  cmExecutionStatus *local_2f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  cmExecutionStatus *local_2d0;
  string local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  cmMakefile *local_268;
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  *local_260;
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  local_250;
  string local_238;
  _Any_data local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  pointer local_1f0;
  pointer local_1e8;
  pointer pMStack_1e0;
  vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_> local_1d8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [24];
  char *pcStack_190;
  undefined1 local_188 [16];
  _Any_data local_178;
  _Manager_type local_168;
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  vStack_160;
  anon_class_40_5_733c87e0 local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Any_data local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_> local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined8 local_a8;
  undefined1 local_a0 [72];
  undefined1 local_58;
  anon_class_32_4_cfdc72da local_50;
  
  local_140.expArg = &local_348;
  local_140.expArgs = &local_2e8;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140.rawArg = &local_340;
  local_340 = 0;
  local_348 = 0;
  pcVar14 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
            _M_impl.super__Vector_impl_data._M_start;
  psVar10 = &local_348;
  local_140.args = args;
  local_140.status = status;
  local_50.args = args;
  local_50.rawArg = local_140.rawArg;
  local_50.status = status;
  local_50.expArgs = local_140.expArgs;
  if (((long)(args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
             _M_impl.super__Vector_impl_data._M_finish - (long)pcVar14 >> 4) * -0x5555555555555555
      == 0) {
LAB_00247660:
    local_140.expArg = psVar10;
    local_2a8._M_allocated_capacity = (size_type)&local_298;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a8,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    cmSystemTools::s_FatalErrorOccurred = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_allocated_capacity != &local_298) {
LAB_002476b2:
      cmSystemTools::s_FatalErrorOccurred = true;
      operator_delete((void *)local_2a8._M_allocated_capacity,
                      (ulong)(local_298._M_allocated_capacity + 1));
    }
  }
  else {
    local_340 = 0;
    do {
      local_2a8._M_allocated_capacity = 0;
      local_2a8._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_298._M_allocated_capacity = 0;
      pcVar19 = pcVar14 + local_340;
      local_340 = local_340 + 1;
      std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
      emplace_back<cmListFileArgument_const&>
                ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
                 local_2a8._M_local_buf,pcVar19);
      cmMakefile::ExpandArguments
                (status->Makefile,
                 (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&local_2a8,
                 &local_2e8);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&local_2a8);
      pbVar5 = local_2e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = local_348;
      bVar21 = local_348 <
               (ulong)((long)local_2e8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_2e8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5);
      if (bVar21) break;
      pcVar14 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (local_340 <
             (ulong)(((long)(args->
                            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar14 >> 4) *
                    -0x5555555555555555));
    psVar10 = local_140.expArg;
    if (!bVar21) goto LAB_00247660;
    pbVar3 = local_2e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_348;
    if ((local_2e8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[local_348]._M_string_length != 0x17) ||
       (iVar12 = bcmp((pbVar3->_M_dataplus)._M_p,"SET_DEPENDENCY_PROVIDER",0x17), iVar12 != 0)) {
      local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
      if ((pbVar3->_M_string_length != 5) ||
         (iVar12 = bcmp((pbVar3->_M_dataplus)._M_p,"DEFER",5), iVar12 != 0)) goto LAB_002474fc;
      local_348 = uVar1 + 1;
      bVar21 = local_348 <
               (ulong)((long)local_2e8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5);
      if (bVar21) {
LAB_00247b5b:
        if (bVar21) {
          local_2a8._M_allocated_capacity = (size_type)&local_298;
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_298._M_allocated_capacity = local_298._M_allocated_capacity & 0xffffffffffffff00;
          local_288._M_allocated_capacity = (size_type)&local_278;
          local_288._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_278._M_local_buf[0] = '\0';
          local_268 = (cmMakefile *)0x0;
          local_2f0 = status;
LAB_00247b9c:
          pvVar7 = local_140.expArgs;
          psVar10 = local_140.expArg;
          pcVar6 = local_2f0;
          bVar21 = local_348 <
                   (ulong)((long)local_2e8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_2e8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          if (!bVar21) {
            pcVar14 = (args->
                      super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            if (local_340 <
                (ulong)(((long)(args->
                               super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar14 >> 4) *
                       -0x5555555555555555)) {
              do {
                local_338._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_338._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_328 = (code *)0x0;
                pcVar19 = pcVar14 + local_340;
                local_340 = local_340 + 1;
                std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
                emplace_back<cmListFileArgument_const&>
                          ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
                           local_338,pcVar19);
                cmMakefile::ExpandArguments
                          (pcVar6->Makefile,
                           (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                           local_338,&local_2e8);
                std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                          ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                           local_338);
                bVar21 = *psVar10 <
                         (ulong)((long)(pvVar7->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar7->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 5);
                if (bVar21) break;
                pcVar14 = (args->
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          )._M_impl.super__Vector_impl_data._M_start;
              } while (local_340 <
                       (ulong)(((long)(args->
                                      super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar14 >>
                               4) * -0x5555555555555555));
              goto LAB_00247c70;
            }
LAB_00248af0:
            bVar21 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()(&local_140);
            status = local_2f0;
            if (((!bVar21) ||
                (local_2e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_348]._M_string_length != 4)) ||
               (iVar12 = bcmp(local_2e8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_348]._M_dataplus._M_p,
                              "CALL",4), iVar12 != 0)) {
              local_338._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&local_328;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_338,"DEFER must be followed by a CALL argument","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002492d5;
            }
            std::optional<(anonymous_namespace)::Defer>::operator=
                      ((optional<(anonymous_namespace)::Defer> *)local_1b8,(Defer *)&local_2a8);
            bVar21 = true;
            goto LAB_002492f9;
          }
LAB_00247c70:
          pbVar5 = local_2e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar1 = local_348;
          if (!bVar21) goto LAB_00248af0;
          local_2d0 = (cmExecutionStatus *)
                      (local_2e8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_348);
          __n = local_2e8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_348]._M_string_length;
          uVar2 = __n - 2;
          if (10 < uVar2) goto switchD_00247cb7_caseD_1;
          pcVar4 = local_2e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_348]._M_dataplus._M_p;
          switch(uVar2) {
          case 0:
switchD_00247cb7_caseD_0:
            iVar12 = bcmp(pcVar4,"ID",__n);
            pvVar7 = local_140.expArgs;
            psVar10 = local_140.expArg;
            status = local_2f0;
            if (iVar12 == 0) {
              local_348 = uVar1 + 1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._8_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                local_338._0_8_ = &local_328;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_338,"DEFER given multiple ID arguments","");
                status = local_2f0;
                std::__cxx11::string::_M_assign((string *)&local_2f0->Error);
                goto LAB_002492d5;
              }
              bVar21 = local_348 <
                       (ulong)((long)local_2e8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5)
              ;
              if (bVar21) {
LAB_00247ff9:
                if (bVar21) {
                  local_348 = local_348 + 1;
                  std::__cxx11::string::_M_assign((string *)local_2a8._M_local_buf);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a8._8_8_ ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    local_338._0_8_ = &local_328;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_338,"DEFER ID may not be empty","");
                    std::__cxx11::string::_M_assign((string *)&status->Error);
                    goto LAB_002492d5;
                  }
                  if ((byte)(*(char *)local_2a8._M_allocated_capacity + 0xbfU) < 0x1a) {
                    local_338._0_8_ = &local_328;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_338,"DEFER ID may not start in A-Z.","");
                    std::__cxx11::string::_M_assign((string *)&status->Error);
                    goto LAB_002492d5;
                  }
                  goto LAB_00247b9c;
                }
              }
              else {
                pcVar14 = (args->
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                if (local_340 <
                    (ulong)(((long)(args->
                                   super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar14 >> 4)
                           * -0x5555555555555555)) {
                  do {
                    local_338._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_338._8_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_328 = (code *)0x0;
                    pcVar19 = pcVar14 + local_340;
                    local_340 = local_340 + 1;
                    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
                    emplace_back<cmListFileArgument_const&>
                              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
                               local_338,pcVar19);
                    cmMakefile::ExpandArguments
                              (status->Makefile,
                               (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                               local_338,&local_2e8);
                    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                               local_338);
                    bVar21 = *psVar10 <
                             (ulong)((long)(pvVar7->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pvVar7->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start >> 5);
                    if (bVar21) break;
                    pcVar14 = (args->
                              super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                  } while (local_340 <
                           (ulong)(((long)(args->
                                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pcVar14 >> 4) * -0x5555555555555555));
                  goto LAB_00247ff9;
                }
              }
              local_338._0_8_ = &local_328;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_338,"DEFER ID missing value","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002492d5;
            }
            if (__n == 6) goto switchD_00247cb7_caseD_4;
            break;
          case 2:
            iVar12 = bcmp(pcVar4,"CALL",__n);
            if (iVar12 == 0) goto LAB_00248af0;
            switch(uVar2) {
            case 0:
              goto switchD_00247cb7_caseD_0;
            case 4:
              goto switchD_00247cb7_caseD_4;
            case 6:
              goto switchD_00247cb7_caseD_6;
            case 7:
              goto switchD_00247cb7_caseD_7;
            case 9:
              goto switchD_00247cb7_caseD_9;
            case 10:
              goto switchD_00247cb7_caseD_a;
            }
            break;
          case 4:
switchD_00247cb7_caseD_4:
            iVar12 = bcmp(pcVar4,"ID_VAR",__n);
            pvVar7 = local_140.expArgs;
            psVar10 = local_140.expArg;
            status = local_2f0;
            if (iVar12 != 0) break;
            local_348 = uVar1 + 1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._8_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              local_338._0_8_ = &local_328;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_338,"DEFER given multiple ID_VAR arguments","");
              status = local_2f0;
              std::__cxx11::string::_M_assign((string *)&local_2f0->Error);
              goto LAB_002492d5;
            }
            bVar21 = local_348 <
                     (ulong)((long)local_2e8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5);
            if (!bVar21) {
              pcVar14 = (args->
                        super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_340 <
                  (ulong)(((long)(args->
                                 super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar14 >> 4) *
                         -0x5555555555555555)) {
                do {
                  local_338._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_338._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_328 = (code *)0x0;
                  pcVar19 = pcVar14 + local_340;
                  local_340 = local_340 + 1;
                  std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
                  emplace_back<cmListFileArgument_const&>
                            ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
                             local_338,pcVar19);
                  cmMakefile::ExpandArguments
                            (status->Makefile,
                             (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                             local_338,&local_2e8);
                  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                             local_338);
                  bVar21 = *psVar10 <
                           (ulong)((long)(pvVar7->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pvVar7->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start >> 5);
                  if (bVar21) break;
                  pcVar14 = (args->
                            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                } while (local_340 <
                         (ulong)(((long)(args->
                                        super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar14
                                 >> 4) * -0x5555555555555555));
                goto LAB_00247ed4;
              }
LAB_00248dbb:
              local_338._0_8_ = &local_328;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_338,"DEFER ID_VAR missing variable name","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002492d5;
            }
LAB_00247ed4:
            if (!bVar21) goto LAB_00248dbb;
            local_348 = local_348 + 1;
            std::__cxx11::string::_M_assign((string *)local_288._M_local_buf);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._8_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) goto LAB_00248f0e;
            goto LAB_00247b9c;
          case 6:
switchD_00247cb7_caseD_6:
            iVar12 = bcmp(pcVar4,"GET_CALL",__n);
            if (iVar12 != 0) {
              if (__n == 2) goto switchD_00247cb7_caseD_0;
              if (__n == 6) goto switchD_00247cb7_caseD_4;
              if (__n == 9) goto switchD_00247cb7_caseD_7;
              break;
            }
LAB_00248ec7:
            status = local_2f0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._8_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0 || (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2a8._8_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
              pcStack_320 = (code *)local_2d0->Makefile;
              local_328 = (code *)(local_2d0->Error)._M_dataplus._M_p;
              local_338._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x6;
              local_338._8_8_ = "DEFER ";
              local_318.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_0000001e;
              local_318.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6c0738;
              views_04._M_len = 3;
              views_04._M_array = (iterator)local_338;
              cmCatViews_abi_cxx11_((string *)&local_210,views_04);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_00248c37;
            }
            cmCMakeLanguageCommand::anon_class_32_4_cfdc72da::operator()(&local_50);
            bVar11 = anon_unknown.dwarf_7a3ef3::cmCMakeLanguageCommandDEFER
                               ((Defer *)&local_2a8,&local_2e8,local_348,status);
            bVar21 = false;
            goto LAB_002492fb;
          case 7:
switchD_00247cb7_caseD_7:
            iVar12 = bcmp(pcVar4,"DIRECTORY",__n);
            pvVar7 = local_140.expArgs;
            psVar10 = local_140.expArg;
            status = local_2f0;
            if (iVar12 != 0) {
              if (__n == 6) goto switchD_00247cb7_caseD_4;
              if (__n == 2) goto switchD_00247cb7_caseD_0;
              break;
            }
            local_348 = uVar1 + 1;
            if (local_268 != (cmMakefile *)0x0) {
              local_338._0_8_ = &local_328;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_338,"DEFER given multiple DIRECTORY arguments","");
              status = local_2f0;
              std::__cxx11::string::_M_assign((string *)&local_2f0->Error);
              goto LAB_002492d5;
            }
            bVar21 = local_348 <
                     (ulong)((long)local_2e8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5);
            if (!bVar21) {
              pcVar14 = (args->
                        super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_340 <
                  (ulong)(((long)(args->
                                 super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar14 >> 4) *
                         -0x5555555555555555)) {
                do {
                  local_338._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_338._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_328 = (code *)0x0;
                  pcVar19 = pcVar14 + local_340;
                  local_340 = local_340 + 1;
                  std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
                  emplace_back<cmListFileArgument_const&>
                            ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
                             local_338,pcVar19);
                  cmMakefile::ExpandArguments
                            (status->Makefile,
                             (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                             local_338,&local_2e8);
                  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                             local_338);
                  bVar21 = *psVar10 <
                           (ulong)((long)(pvVar7->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pvVar7->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start >> 5);
                  if (bVar21) break;
                  pcVar14 = (args->
                            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                } while (local_340 <
                         (ulong)(((long)(args->
                                        super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar14
                                 >> 4) * -0x5555555555555555));
                goto LAB_00248132;
              }
LAB_002491ba:
              local_338._0_8_ = &local_328;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_338,"DEFER DIRECTORY missing value","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002492d5;
            }
LAB_00248132:
            if (!bVar21) goto LAB_002491ba;
            local_210._M_unused._M_object = &local_200;
            pcVar4 = local_2e8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_348]._M_dataplus._M_p;
            pbVar5 = local_2e8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_348;
            local_348 = local_348 + 1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_210,pcVar4,pcVar4 + pbVar5->_M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._8_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              local_338._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&local_328;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_338,"DEFER DIRECTORY may not be empty","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              cmSystemTools::s_FatalErrorOccurred = true;
              uVar20 = local_328;
              _Var18._M_p = (pointer)local_338._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_338._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&local_328) {
LAB_0024943d:
                cmSystemTools::s_FatalErrorOccurred = true;
                operator_delete(_Var18._M_p,(ulong)(uVar20 + 1));
              }
              goto LAB_00248c41;
            }
            psVar15 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
            cmsys::SystemTools::CollapseFullPath((string *)local_338,(string *)&local_210,psVar15);
            std::__cxx11::string::operator=((string *)local_210._M_pod_data,(string *)local_338);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&local_328) {
              operator_delete((void *)local_338._0_8_,(ulong)((long)local_328 + 1));
            }
            this_01 = cmMakefile::GetGlobalGenerator(status->Makefile);
            local_268 = cmGlobalGenerator::FindMakefile(this_01,(string *)&local_210);
            if (local_268 != (cmMakefile *)0x0) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._M_unused._0_8_ != &local_200) {
                operator_delete(local_210._M_unused._M_object,
                                (ulong)(local_200._M_allocated_capacity + 1));
              }
              goto LAB_00247b9c;
            }
            local_338._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x13;
            local_338._8_8_ = "DEFER DIRECTORY:\n  ";
            local_328 = (code *)local_210._8_8_;
            pcStack_320 = (code *)local_210._M_unused._0_8_;
            local_318.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x10;
            local_318.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6c07d3;
            local_318.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x23;
            local_300 = "It may not have been processed yet.";
            views_05._M_len = 4;
            views_05._M_array = (iterator)local_338;
            cmCatViews_abi_cxx11_(&local_2c8,views_05);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            cmSystemTools::s_FatalErrorOccurred = true;
            uVar20 = local_2c8.field_2._M_allocated_capacity;
            _Var18._M_p = local_2c8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) goto LAB_0024943d;
            goto LAB_00248c41;
          case 9:
switchD_00247cb7_caseD_9:
            iVar12 = bcmp(pcVar4,"CANCEL_CALL",__n);
            if (iVar12 == 0) goto LAB_00248ec7;
            switch(uVar2) {
            case 0:
              goto switchD_00247cb7_caseD_0;
            case 4:
              goto switchD_00247cb7_caseD_4;
            case 6:
              goto switchD_00247cb7_caseD_6;
            case 7:
              goto switchD_00247cb7_caseD_7;
            case 10:
              goto switchD_00247cb7_caseD_a;
            }
            break;
          case 10:
switchD_00247cb7_caseD_a:
            iVar12 = bcmp(pcVar4,"GET_CALL_IDS",__n);
            if (iVar12 == 0) goto LAB_00248ec7;
            switch(uVar2) {
            case 0:
              goto switchD_00247cb7_caseD_0;
            case 4:
              goto switchD_00247cb7_caseD_4;
            case 6:
              goto switchD_00247cb7_caseD_6;
            case 7:
              goto switchD_00247cb7_caseD_7;
            }
          }
switchD_00247cb7_caseD_1:
          pcStack_320 = (code *)local_2d0->Makefile;
          local_328 = (code *)(local_2d0->Error)._M_dataplus._M_p;
          local_338._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x18;
          local_338._8_8_ = "DEFER unknown option:\n  ";
          views_02._M_len = 2;
          views_02._M_array = (iterator)local_338;
          cmCatViews_abi_cxx11_((string *)&local_210,views_02);
          status = local_2f0;
          std::__cxx11::string::_M_assign((string *)&local_2f0->Error);
LAB_00248c37:
          cmSystemTools::s_FatalErrorOccurred = true;
LAB_00248c41:
          uVar20 = local_210._M_unused._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_unused._0_8_ == &local_200) goto LAB_002492f6;
          goto LAB_002492ee;
        }
      }
      else {
        pcVar14 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (local_340 <
            (ulong)(((long)(args->
                           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar14 >> 4) *
                   -0x5555555555555555)) {
          do {
            local_2a8._M_allocated_capacity = 0;
            local_2a8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_298._M_allocated_capacity = 0;
            pcVar19 = pcVar14 + local_340;
            local_340 = local_340 + 1;
            std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
            emplace_back<cmListFileArgument_const&>
                      ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
                       local_2a8._M_local_buf,pcVar19);
            cmMakefile::ExpandArguments
                      (status->Makefile,
                       (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&local_2a8
                       ,&local_2e8);
            std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                      ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&local_2a8
                      );
            bVar21 = local_348 <
                     (ulong)((long)local_2e8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_2e8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            if (bVar21) break;
            pcVar14 = (args->
                      super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (local_340 <
                   (ulong)(((long)(args->
                                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar14 >> 4)
                          * -0x5555555555555555));
          goto LAB_00247b5b;
        }
      }
      local_2a8._M_allocated_capacity = (size_type)&local_298;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a8,"DEFER requires at least one argument","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_00248591;
    }
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    vector<__gnu_cxx::__normal_iterator<cmListFileArgument_const*,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>,void>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
               local_2a8._M_local_buf,
               (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
               _M_impl.super__Vector_impl_data._M_start + local_340,
               (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
               _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)local_1b8);
    cmMakefile::ExpandArguments
              (status->Makefile,
               (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&local_2a8,
               &local_2e8);
    local_340 = ((long)(args->
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&local_2a8);
    this_00 = cmMakefile::GetState(status->Makefile);
    if (this_00->ProcessingTopLevelIncludes != false) {
      vStack_160.
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_160.
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168 = (_Manager_type)0x0;
      vStack_160.
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_178._0_8_ = 0;
      local_178._8_8_ = (_Manager_type)0x0;
      local_188._0_8_ = (_Invoker_type)0x0;
      local_188._8_8_ = (void *)0x0;
      local_1a8._16_8_ = 0;
      pcStack_190 = (char *)0x0;
      local_1a8._0_8_ = 0;
      local_1a8._8_8_ = (void *)0x0;
      local_1b8._0_8_ = (pointer)0x0;
      local_1b8._8_8_ = (pointer)0x0;
      local_338._0_8_ = (void *)0x0;
      local_338._8_8_ = 0;
      pcStack_320 = std::
                    _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                    ::_M_invoke;
      local_328 = std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                  ::_M_manager;
      name._M_str = "SET_DEPENDENCY_PROVIDER";
      name._M_len = 0x17;
      ArgumentParser::Base::Bind((Base *)local_1b8,name,(KeywordAction *)local_338);
      if (local_328 != (_Manager_type)0x0) {
        (*local_328)(local_338,local_338,3);
      }
      local_338._8_8_ = 0;
      local_338._0_8_ = 0x20;
      pcStack_320 = std::
                    _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                    ::_M_invoke;
      local_328 = std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                  ::_M_manager;
      name_00._M_str = "SUPPORTED_METHODS";
      name_00._M_len = 0x11;
      ArgumentParser::Base::Bind((Base *)local_1b8,name_00,(KeywordAction *)local_338);
      if (local_328 != (_Manager_type)0x0) {
        (*local_328)(local_338,local_338,3);
      }
      ArgumentParser::ActionMap::ActionMap((ActionMap *)&local_2a8,(ActionMap *)local_1b8);
      std::
      vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ::~vector(&vStack_160);
      if ((_Manager_type)local_178._8_8_ != (_Manager_type)0x0) {
        (*(code *)local_178._8_8_)(local_188 + 8,local_188 + 8,3);
      }
      if ((_Manager_type)pcStack_190 != (_Manager_type)0x0) {
        (*(code *)pcStack_190)(local_1a8 + 8,local_1a8 + 8,3);
      }
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                 *)local_1b8);
      local_1a8._0_8_ = &local_b8;
      local_a8 = 0;
      local_b8._M_allocated_capacity = 0;
      local_b8._8_8_ = (undefined8 *)0x0;
      local_338._0_8_ = &local_328;
      local_338._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_328 = (code *)((ulong)local_328 & 0xffffffffffffff00);
      local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1b8._8_8_ = (pointer)0x0;
      local_1a8._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      pcStack_190 = (char *)0x0;
      local_188._0_8_ = (_Invoker_type)0x0;
      local_188._8_8_ = (void *)0x0;
      local_178._0_8_ = 0;
      local_178._8_8_ = (_Manager_type)0x0;
      local_168 = (_Manager_type)0x0;
      vStack_160.
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_160.
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)vStack_160.
                            super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      local_1b8._0_8_ = &local_2a8;
      local_1a8._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_338;
      ArgumentParser::Instance::
      Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((Instance *)local_1b8,&local_2e8,0);
      if (local_168 != (_Manager_type)0x0) {
        (*local_168)(&local_178,&local_178,__destroy_functor);
      }
      if (local_b8._M_allocated_capacity == local_b8._8_8_) {
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        local_1b8._0_8_ = (pointer)0x2c;
        local_2c8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_2c8,(ulong)local_1b8);
        local_2c8.field_2._M_allocated_capacity = local_1b8._0_8_;
        builtin_strncpy((char *)((long)local_2c8._M_dataplus._M_p + 0x1c),"_SERIAL_",8);
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p + 0x24) = 'P';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p + 0x25) = 'R';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p + 0x26) = 'O';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p + 0x27) = 'V';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p + 0x28) = 'I';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p + 0x29) = 'D';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p + 0x2a) = 'E';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p + 0x2b) = 'R';
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)((long)local_2c8._M_dataplus._M_p + 0x10))->_M_allocated_capacity = 0x4c49415641454b41;
        *(undefined8 *)((long)local_2c8._M_dataplus._M_p + 0x18) = 0x5245535f454c4241;
        *(undefined4 *)local_2c8._M_dataplus._M_p = 0x45465f5f;
        builtin_strncpy((char *)((long)local_2c8._M_dataplus._M_p + 4),"TCHC",4);
        builtin_strncpy((char *)((long)local_2c8._M_dataplus._M_p + 8),"ONTE",4);
        builtin_strncpy((char *)((long)local_2c8._M_dataplus._M_p + 0xc),"NT_M",4);
        local_2c8._M_string_length = local_1b8._0_8_;
        local_2c8._M_dataplus._M_p[local_1b8._0_8_] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._8_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          if (local_318.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_318.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            if ((this_00->DependencyProvider).
                super__Optional_base<cmDependencyProvider,_false,_false>._M_payload.
                super__Optional_payload<cmDependencyProvider,_true,_false,_false>.
                super__Optional_payload_base<cmDependencyProvider>._M_engaged == true) {
              std::_Optional_payload_base<cmDependencyProvider>::_M_destroy
                        ((_Optional_payload_base<cmDependencyProvider> *)
                         &this_00->DependencyProvider);
            }
            bVar11 = true;
            cmState::SetGlobalProperty(this_00,&local_2c8,"");
          }
          else {
            local_1b8._0_8_ = local_1a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,
                       "Must specify a non-empty command name when provider methods are given","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            cmSystemTools::s_FatalErrorOccurred = true;
            if ((undefined1 *)local_1b8._0_8_ != local_1a8) {
              operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
            }
            bVar11 = false;
          }
        }
        else {
          _Var18._M_p = (pointer)local_1b8._0_8_;
          cmState::GetCommand((Command *)&local_f8,this_00,(string *)local_338);
          pbVar5 = local_318.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((code *)local_e8._M_allocated_capacity == (code *)0x0) {
            local_1b8._0_8_ = (pointer)0x9;
            local_1b8._8_8_ = "Command \"";
            local_1a8._0_8_ = local_338._8_8_;
            local_1a8._8_8_ = local_338._0_8_;
            local_1a8._16_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1a;
            pcStack_190 = "\" is not a defined command";
            views_03._M_len = 3;
            views_03._M_array = (iterator)local_1b8;
            cmCatViews_abi_cxx11_(&local_238,views_03);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            cmSystemTools::s_FatalErrorOccurred = true;
            uVar20 = local_238.field_2._M_allocated_capacity;
            _Var18._M_p = local_238._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
LAB_00248e80:
              cmSystemTools::s_FatalErrorOccurred = true;
              operator_delete(_Var18._M_p,(ulong)(uVar20 + 1));
            }
LAB_00248e88:
            bVar11 = false;
          }
          else {
            if (local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_1b8._0_8_ = local_1a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1b8,"Must specify at least one provider method","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              cmSystemTools::s_FatalErrorOccurred = true;
              uVar20 = local_1a8._0_8_;
              _Var18._M_p = (pointer)local_1b8._0_8_;
              if ((undefined1 *)local_1b8._0_8_ != local_1a8) goto LAB_00248e80;
              goto LAB_00248e88;
            }
            local_1d8.
            super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_1d8.
            super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
            ._M_impl.super__Vector_impl_data._M_finish = (Method *)0x0;
            local_1d8.
            super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (Method *)0x0;
            local_2f0 = (cmExecutionStatus *)&status->Error;
            bVar11 = false;
            local_2d0 = (cmExecutionStatus *)((ulong)local_2d0 & 0xffffffff00000000);
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_318.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            do {
              iVar12 = std::__cxx11::string::compare(paVar16->_M_local_buf);
              if (iVar12 == 0) {
                local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
                if (local_1d8.
                    super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_1d8.
                    super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                  ::_M_realloc_insert<cmDependencyProvider::Method>
                            (&local_1d8,
                             (iterator)
                             local_1d8.
                             super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(Method *)local_1b8);
                }
                else {
                  *local_1d8.
                   super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                   ._M_impl.super__Vector_impl_data._M_finish = FindPackage;
                  local_1d8.
                  super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       local_1d8.
                       super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
                bVar21 = true;
              }
              else {
                iVar12 = std::__cxx11::string::compare(paVar16->_M_local_buf);
                if (iVar12 == 0) {
                  local_1b8._0_4_ = 1;
                  if (local_1d8.
                      super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                      ._M_impl.super__Vector_impl_data._M_finish ==
                      local_1d8.
                      super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                    ::_M_realloc_insert<cmDependencyProvider::Method>
                              (&local_1d8,
                               (iterator)
                               local_1d8.
                               super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                               ._M_impl.super__Vector_impl_data._M_finish,(Method *)local_1b8);
                  }
                  else {
                    *local_1d8.
                     super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                     ._M_impl.super__Vector_impl_data._M_finish = FetchContentMakeAvailableSerial;
                    local_1d8.
                    super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         local_1d8.
                         super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  bVar21 = true;
                  _Var18._M_p = (pointer)CONCAT71((int7)((ulong)_Var18._M_p >> 8),1);
                  local_2d0 = (cmExecutionStatus *)CONCAT44(local_2d0._4_4_,(int)_Var18._M_p);
                }
                else {
                  local_1a8._8_8_ = paVar16->_M_allocated_capacity;
                  _Var18._M_p = *(pointer *)((long)paVar16 + 8);
                  local_1b8._0_8_ = (pointer)0x24;
                  local_1b8._8_8_ = "Unknown dependency provider method \"";
                  local_1a8._16_8_ = &DAT_00000001;
                  pcStack_190 = "\"";
                  views_00._M_len = 3;
                  views_00._M_array = (iterator)local_1b8;
                  local_1a8._0_8_ = _Var18._M_p;
                  cmCatViews_abi_cxx11_(&local_238,views_00);
                  std::__cxx11::string::_M_assign((string *)local_2f0);
                  cmSystemTools::s_FatalErrorOccurred = true;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_238._M_dataplus._M_p != &local_238.field_2) {
                    operator_delete(local_238._M_dataplus._M_p,
                                    (ulong)(local_238.field_2._M_allocated_capacity + 1));
                  }
                  bVar21 = false;
                }
              }
              if (!bVar21) break;
              paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar16->_M_local_buf + 0x20);
              bVar11 = paVar16 ==
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)pbVar5;
            } while (!bVar11);
            if (bVar11) {
              local_118 = &local_108;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_118,local_338._0_8_,
                         (char *)(local_338._8_8_ + local_338._0_8_));
              std::
              vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>::
              vector(&local_d8,&local_1d8);
              local_210._M_unused._M_object = &local_200;
              if (local_118 == &local_108) {
                local_200._8_8_ = local_108._8_8_;
              }
              else {
                local_210._M_unused._M_object = local_118;
              }
              local_210._8_8_ = local_110;
              local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0;
              local_108._M_local_buf[0] = '\0';
              local_1f0 = local_d8.
                          super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_1e8 = local_d8.
                          super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              pMStack_1e0 = local_d8.
                            super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_d8.
              super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_d8.
              super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_d8.
              super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_118 = &local_108;
              std::optional<cmDependencyProvider>::operator=
                        (&this_00->DependencyProvider,(cmDependencyProvider *)&local_210);
              cmDependencyProvider::~cmDependencyProvider((cmDependencyProvider *)&local_210);
              if (local_d8.
                  super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.
                                super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_d8.
                                      super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_d8.
                                      super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_118 != &local_108) {
                operator_delete(local_118,
                                CONCAT71(local_108._M_allocated_capacity._1_7_,
                                         local_108._M_local_buf[0]) + 1);
              }
              paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_338._0_8_;
              if (((ulong)local_2d0 & 1) == 0) {
                paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x71dc05;
              }
              cmState::SetGlobalProperty(this_00,&local_2c8,paVar16->_M_local_buf);
            }
            if (local_1d8.
                super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1d8.
                              super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_1d8.
                                    super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1d8.
                                    super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          if ((code *)local_e8._M_allocated_capacity != (code *)0x0) {
            (*(code *)local_e8._M_allocated_capacity)(&local_f8,&local_f8,3);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,
                          (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
        }
      }
      else {
        local_1a8._8_8_ = *(undefined8 *)local_b8._M_allocated_capacity;
        local_1a8._0_8_ = *(undefined8 *)(local_b8._M_allocated_capacity + 8);
        local_1b8._0_8_ = (pointer)0x17;
        local_1b8._8_8_ = "Unrecognized keyword: \"";
        local_1a8._16_8_ = &DAT_00000001;
        pcStack_190 = "\"";
        views._M_len = 3;
        views._M_array = (iterator)local_1b8;
        cmCatViews_abi_cxx11_(&local_2c8,views);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        cmSystemTools::s_FatalErrorOccurred = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,
                          (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
        }
        bVar11 = false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_318);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_328) {
        operator_delete((void *)local_338._0_8_,(ulong)((long)local_328 + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_b8);
      std::
      vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ::~vector(&local_250);
      if (local_260 !=
          (vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
           *)0x0) {
        (*(code *)local_260)(local_278._M_local_buf + 8,local_278._M_local_buf + 8,3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (*(code *)local_288._8_8_)(local_298._M_local_buf + 8,local_298._M_local_buf + 8,3);
      }
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                 *)&local_2a8);
      goto LAB_00249198;
    }
    local_1b8._0_8_ = (pointer)0xf8;
    local_2a8._M_allocated_capacity = (size_type)&local_298;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create(&local_2a8._M_allocated_capacity,(ulong)local_1b8);
    uVar20 = local_1b8._0_8_;
    local_298._M_allocated_capacity = local_1b8._0_8_;
    local_2a8._M_allocated_capacity = (size_type)paVar16;
    memcpy(paVar16,
           "Dependency providers can only be set as part of the first call to project(). More specifically, cmake_language(SET_DEPENDENCY_PROVIDER) can only be called while the first project() command processes files listed in CMAKE_PROJECT_TOP_LEVEL_INCLUDES."
           ,0xf8);
    local_2a8._8_8_ = uVar20;
    paVar16->_M_local_buf[uVar20] = '\0';
    std::__cxx11::string::_M_assign((string *)&status->Error);
    cmSystemTools::s_FatalErrorOccurred = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_allocated_capacity != &local_298) goto LAB_002476b2;
  }
  bVar11 = false;
LAB_00249198:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e8);
  return bVar11;
LAB_00248f0e:
  local_338._0_8_ = &local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"DEFER ID_VAR may not be empty","");
  std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002492d5:
  cmSystemTools::s_FatalErrorOccurred = true;
  local_200._M_allocated_capacity = (size_type)local_328;
  uVar20 = local_338._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_328) {
LAB_002492ee:
    operator_delete((void *)uVar20,(ulong)(local_200._M_allocated_capacity + 1));
  }
LAB_002492f6:
  bVar21 = false;
LAB_002492f9:
  bVar11 = false;
LAB_002492fb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_allocated_capacity != &local_278) {
    operator_delete((void *)local_288._M_allocated_capacity,
                    CONCAT71(local_278._M_allocated_capacity._1_7_,local_278._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_allocated_capacity != &local_298) {
    operator_delete((void *)local_2a8._M_allocated_capacity,
                    (ulong)(local_298._M_allocated_capacity + 1));
  }
  if (bVar21) {
LAB_002474fc:
    iVar12 = std::__cxx11::string::compare
                       ((char *)(local_2e8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + local_348));
    pvVar9 = local_140.args;
    psVar8 = local_140.rawArg;
    pvVar7 = local_140.expArgs;
    psVar10 = local_140.expArg;
    if (iVar12 == 0) {
      local_348 = local_348 + 1;
      bVar21 = *local_140.expArg <
               (ulong)((long)((local_140.expArgs)->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)((local_140.expArgs)->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5);
      local_2f0 = status;
      if (bVar21) {
LAB_002476fd:
        if (bVar21) {
          uVar1 = local_348 + 1;
          if (uVar1 == (long)local_2e8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_2e8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5) {
            psVar15 = local_2e8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_348;
            local_58 = 0;
            if (local_178._M_pod_data[8] == '\x01') {
              local_a0._0_8_ = (long)local_a0 + 0x10;
              if ((undefined1 *)local_1b8._0_8_ == local_1a8) {
                local_a0._24_8_ = local_1a8._8_8_;
              }
              else {
                local_a0._0_8_ = local_1b8._0_8_;
              }
              local_a0._32_8_ =
                   &(((_Storage<(anonymous_namespace)::Defer,_false> *)local_a0)->_M_value).IdVar.
                    field_2;
              local_a0._8_8_ = local_1b8._8_8_;
              local_1b8._8_8_ = (pointer)0x0;
              local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._16_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188) {
                local_a0._56_8_ = local_188._8_8_;
              }
              else {
                local_a0._32_8_ = local_1a8._16_8_;
              }
              local_a0._40_8_ = pcStack_190;
              pcStack_190 = (char *)0x0;
              local_188._0_8_ = local_188._0_8_ & 0xffffffffffffff00;
              local_a0._64_8_ = local_178._0_8_;
              local_58 = 1;
              local_1b8._0_8_ = local_1a8;
              local_1a8._16_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_188;
            }
            local_348 = uVar1;
            bVar11 = anon_unknown.dwarf_7a3ef3::cmCMakeLanguageCommandCALL
                               (args,psVar15,local_340,
                                (optional<(anonymous_namespace)::Defer> *)
                                &((_Storage<(anonymous_namespace)::Defer,_false> *)local_a0)->
                                 _M_value,local_2f0);
            std::_Optional_base<(anonymous_namespace)::Defer,_false,_false>::~_Optional_base
                      ((_Optional_base<(anonymous_namespace)::Defer,_false,_false> *)
                       &((_Storage<(anonymous_namespace)::Defer,_false> *)local_a0)->_M_value);
            goto LAB_002485ba;
          }
          local_2a8._M_allocated_capacity = (size_type)&local_298;
          local_348 = uVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a8,"CALL command\'s arguments must be literal","");
          std::__cxx11::string::_M_assign((string *)&local_2f0->Error);
          goto LAB_00248591;
        }
      }
      else if (*local_140.rawArg <
               (ulong)(((long)((local_140.args)->
                              super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)((local_140.args)->
                              super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555
                      )) {
        local_2d0 = local_140.status;
        do {
          local_2a8._M_allocated_capacity = 0;
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_298._M_allocated_capacity = 0;
          uVar1 = *psVar8;
          *psVar8 = uVar1 + 1;
          std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
          emplace_back<cmListFileArgument_const&>
                    ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
                     local_2a8._M_local_buf,
                     (pvVar9->
                     super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                     _M_impl.super__Vector_impl_data._M_start + uVar1);
          cmMakefile::ExpandArguments
                    (local_2d0->Makefile,
                     (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&local_2a8,
                     pvVar7);
          std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                    ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&local_2a8);
          bVar21 = *psVar10 <
                   (ulong)((long)(pvVar7->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar7->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 5);
          if (bVar21) break;
        } while (*psVar8 < (ulong)(((long)(pvVar9->
                                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pvVar9->
                                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 4) *
                                  -0x5555555555555555));
        goto LAB_002476fd;
      }
      local_2a8._M_allocated_capacity = (size_type)&local_298;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a8,"CALL missing command name","");
      std::__cxx11::string::_M_assign((string *)&local_2f0->Error);
    }
    else {
      iVar12 = std::__cxx11::string::compare
                         ((char *)(local_2e8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_348));
      if (iVar12 == 0) {
        this = status->Makefile;
        cmMakefile::GetBacktrace(this);
        pcVar13 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_338);
        cmListFileContext::cmListFileContext((cmListFileContext *)&local_2a8,pcVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_);
        }
        local_238._M_dataplus._M_p = (pointer)0x0;
        local_238._M_string_length = 0;
        local_238.field_2._M_allocated_capacity = 0;
        cmMakefile::ExpandArguments
                  (this,args,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if (local_238._M_string_length - (long)local_238._M_dataplus._M_p < 0x21) {
          local_338._0_8_ = &local_328;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_338,"called with incorrect number of arguments","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00248a46:
          cmSystemTools::s_FatalErrorOccurred = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_328) {
            operator_delete((void *)local_338._0_8_,(ulong)((long)local_328 + 1));
          }
          bVar11 = false;
        }
        else {
          iVar12 = std::__cxx11::string::compare((char *)(local_238._M_dataplus._M_p + 0x20));
          if (iVar12 != 0) {
            _Var17 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[5]>>
                               ((KeywordAction *)(local_238._M_dataplus._M_p + 0x40),
                                local_238._M_string_length,"CODE");
            if (_Var17._M_current ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_238._M_string_length) {
              local_338._0_8_ = &local_328;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_338,"called without CODE argument","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
            }
            else {
              local_338._0_8_ = &local_328;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_338,
                         "called with unsupported arguments between EVAL and CODE arguments","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
            }
            goto LAB_00248a46;
          }
          local_338._0_8_ = local_238._M_dataplus._M_p + 0x40;
          local_338._8_8_ = local_238._M_string_length;
          separator._M_str = " ";
          separator._M_len = 1;
          cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    (&local_2c8,
                     (cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_338,separator);
          local_338._0_8_ = local_288._8_8_;
          local_338._8_8_ = local_288._M_allocated_capacity;
          local_328 = (code *)&DAT_00000001;
          pcStack_320 = (code *)((long)"    :" + 4);
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)&local_210,(long)local_268);
          local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_210._M_unused._0_8_;
          local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_210._8_8_;
          local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000005;
          local_300 = ":EVAL";
          views_01._M_len = 4;
          views_01._M_array = (iterator)local_338;
          cmCatViews_abi_cxx11_((string *)&local_f8,views_01);
          bVar11 = cmMakefile::ReadListFileAsString(this,&local_2c8,(string *)&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_unused._0_8_ != &local_e8) {
            operator_delete(local_f8._M_unused._M_object,(ulong)(local_e8._M_allocated_capacity + 1)
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,
                            (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_238);
        if (((char)local_250.
                   super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') &&
           (local_250.
            super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = '\0', local_260 != &local_250
           )) {
          operator_delete(local_260,
                          (ulong)((long)&(local_250.
                                          super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->first + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_allocated_capacity != &local_278) {
          operator_delete((void *)local_288._M_allocated_capacity,
                          CONCAT71(local_278._M_allocated_capacity._1_7_,local_278._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_allocated_capacity != &local_298) {
          operator_delete((void *)local_2a8._M_allocated_capacity,
                          (ulong)(local_298._M_allocated_capacity + 1));
        }
        goto LAB_002485ba;
      }
      iVar12 = std::__cxx11::string::compare
                         ((char *)(local_2e8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_348));
      if (iVar12 == 0) {
        bVar11 = anon_unknown.dwarf_7a3ef3::cmCMakeLanguageCommandGET_MESSAGE_LOG_LEVEL(args,status)
        ;
        goto LAB_002485ba;
      }
      local_2a8._M_allocated_capacity = (size_type)&local_298;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a8,"called with unknown meta-operation","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
LAB_00248591:
    cmSystemTools::s_FatalErrorOccurred = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_allocated_capacity != &local_298) {
      operator_delete((void *)local_2a8._M_allocated_capacity,
                      (ulong)(local_298._M_allocated_capacity + 1));
    }
    bVar11 = false;
  }
LAB_002485ba:
  if (local_178._M_pod_data[8] == '\x01') {
    local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
    if ((undefined1 *)local_1a8._16_8_ != local_188) {
      operator_delete((void *)local_1a8._16_8_,(ulong)(local_188._0_8_ + 1));
    }
    if ((undefined1 *)local_1b8._0_8_ != local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
    }
  }
  goto LAB_00249198;
}

Assistant:

bool cmCMakeLanguageCommand(std::vector<cmListFileArgument> const& args,
                            cmExecutionStatus& status)
{
  std::vector<std::string> expArgs;
  size_t rawArg = 0;
  size_t expArg = 0;

  // Helper to consume and expand one raw argument at a time.
  auto moreArgs = [&]() -> bool {
    while (expArg >= expArgs.size()) {
      if (rawArg >= args.size()) {
        return false;
      }
      std::vector<cmListFileArgument> tmpArg;
      tmpArg.emplace_back(args[rawArg++]);
      status.GetMakefile().ExpandArguments(tmpArg, expArgs);
    }
    return true;
  };
  auto finishArgs = [&]() {
    std::vector<cmListFileArgument> tmpArgs(args.begin() + rawArg, args.end());
    status.GetMakefile().ExpandArguments(tmpArgs, expArgs);
    rawArg = args.size();
  };

  if (!moreArgs()) {
    return FatalError(status, "called with incorrect number of arguments");
  }

  if (expArgs[expArg] == "SET_DEPENDENCY_PROVIDER"_s) {
    finishArgs();
    return cmCMakeLanguageCommandSET_DEPENDENCY_PROVIDER(expArgs, status);
  }

  cm::optional<Defer> maybeDefer;
  if (expArgs[expArg] == "DEFER"_s) {
    ++expArg; // Consume "DEFER".

    if (!moreArgs()) {
      return FatalError(status, "DEFER requires at least one argument");
    }

    Defer defer;

    // Process optional arguments.
    while (moreArgs()) {
      if (expArgs[expArg] == "CALL"_s) {
        break;
      }
      if (expArgs[expArg] == "CANCEL_CALL"_s ||
          expArgs[expArg] == "GET_CALL_IDS"_s ||
          expArgs[expArg] == "GET_CALL"_s) {
        if (!defer.Id.empty() || !defer.IdVar.empty()) {
          return FatalError(status,
                            cmStrCat("DEFER "_s, expArgs[expArg],
                                     " does not accept ID or ID_VAR."_s));
        }
        finishArgs();
        return cmCMakeLanguageCommandDEFER(defer, expArgs, expArg, status);
      }
      if (expArgs[expArg] == "DIRECTORY"_s) {
        ++expArg; // Consume "DIRECTORY".
        if (defer.Directory) {
          return FatalError(status,
                            "DEFER given multiple DIRECTORY arguments");
        }
        if (!moreArgs()) {
          return FatalError(status, "DEFER DIRECTORY missing value");
        }
        std::string dir = expArgs[expArg++];
        if (dir.empty()) {
          return FatalError(status, "DEFER DIRECTORY may not be empty");
        }
        dir = cmSystemTools::CollapseFullPath(
          dir, status.GetMakefile().GetCurrentSourceDirectory());
        defer.Directory =
          status.GetMakefile().GetGlobalGenerator()->FindMakefile(dir);
        if (!defer.Directory) {
          return FatalError(status,
                            cmStrCat("DEFER DIRECTORY:\n  "_s, dir,
                                     "\nis not known.  "_s,
                                     "It may not have been processed yet."_s));
        }
      } else if (expArgs[expArg] == "ID"_s) {
        ++expArg; // Consume "ID".
        if (!defer.Id.empty()) {
          return FatalError(status, "DEFER given multiple ID arguments");
        }
        if (!moreArgs()) {
          return FatalError(status, "DEFER ID missing value");
        }
        defer.Id = expArgs[expArg++];
        if (defer.Id.empty()) {
          return FatalError(status, "DEFER ID may not be empty");
        }
        if (defer.Id[0] >= 'A' && defer.Id[0] <= 'Z') {
          return FatalError(status, "DEFER ID may not start in A-Z.");
        }
      } else if (expArgs[expArg] == "ID_VAR"_s) {
        ++expArg; // Consume "ID_VAR".
        if (!defer.IdVar.empty()) {
          return FatalError(status, "DEFER given multiple ID_VAR arguments");
        }
        if (!moreArgs()) {
          return FatalError(status, "DEFER ID_VAR missing variable name");
        }
        defer.IdVar = expArgs[expArg++];
        if (defer.IdVar.empty()) {
          return FatalError(status, "DEFER ID_VAR may not be empty");
        }
      } else {
        return FatalError(
          status, cmStrCat("DEFER unknown option:\n  "_s, expArgs[expArg]));
      }
    }

    if (!(moreArgs() && expArgs[expArg] == "CALL"_s)) {
      return FatalError(status, "DEFER must be followed by a CALL argument");
    }

    maybeDefer = std::move(defer);
  }

  if (expArgs[expArg] == "CALL") {
    ++expArg; // Consume "CALL".

    // CALL requires a command name.
    if (!moreArgs()) {
      return FatalError(status, "CALL missing command name");
    }
    std::string const& callCommand = expArgs[expArg++];

    // CALL accepts no further expanded arguments.
    if (expArg != expArgs.size()) {
      return FatalError(status, "CALL command's arguments must be literal");
    }

    // Run the CALL.
    return cmCMakeLanguageCommandCALL(args, callCommand, rawArg,
                                      std::move(maybeDefer), status);
  }

  if (expArgs[expArg] == "EVAL") {
    return cmCMakeLanguageCommandEVAL(args, status);
  }

  if (expArgs[expArg] == "GET_MESSAGE_LOG_LEVEL") {
    return cmCMakeLanguageCommandGET_MESSAGE_LOG_LEVEL(args, status);
  }

  return FatalError(status, "called with unknown meta-operation");
}